

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::MacroFormalArgumentSyntax::setChild
          (MacroFormalArgumentSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined8 uVar2;
  long lVar3;
  Token TVar4;
  
  if (index == 0) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    pSVar1 = (SyntaxNode *)TVar4.info;
    uVar2 = TVar4._0_8_;
    (this->name).kind = (short)uVar2;
    (this->name).field_0x2 = (char)((ulong)uVar2 >> 0x10);
    (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar2 >> 0x18);
    (this->name).rawLen = (int)((ulong)uVar2 >> 0x20);
    lVar3 = 0x20;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    lVar3 = 0x28;
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
  }
  *(SyntaxNode **)((long)&(this->super_SyntaxNode).kind + lVar3) = pSVar1;
  return;
}

Assistant:

void MacroFormalArgumentSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.token(); return;
        case 1: defaultValue = child.node() ? &child.node()->as<MacroArgumentDefaultSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}